

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

uint64_t fiobj_str_hash(FIOBJ o)

{
  size_t sVar1;
  uint64_t uVar2;
  undefined1 local_30 [8];
  fio_str_info_s state;
  FIOBJ o_local;
  
  state.data = (char *)o;
  sVar1 = fiobj_type_is(o,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    if (*(long *)(((ulong)state.data & 0xfffffffffffffff8) + 8) == 0) {
      fio_str_info((fio_str_info_s *)local_30,
                   (fio_str_s_conflict *)(((ulong)state.data & 0xfffffffffffffff8) + 0x10));
      uVar2 = fiobj_hash_string((void *)state.len,state.capa);
      *(uint64_t *)(((ulong)state.data & 0xfffffffffffffff8) + 8) = uVar2;
      o_local = *(FIOBJ *)(((ulong)state.data & 0xfffffffffffffff8) + 8);
    }
    else {
      o_local = *(FIOBJ *)(((ulong)state.data & 0xfffffffffffffff8) + 8);
    }
    return o_local;
  }
  __assert_fail("FIOBJ_TYPE_IS(o, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0x145,"uint64_t fiobj_str_hash(FIOBJ)");
}

Assistant:

uint64_t fiobj_str_hash(FIOBJ o) {
  assert(FIOBJ_TYPE_IS(o, FIOBJ_T_STRING));
  // if (obj2str(o)->is_small) {
  //   return fiobj_hash_string(STR_INTENAL_STR(o), STR_INTENAL_LEN(o));
  // } else
  if (obj2str(o)->hash) {
    return obj2str(o)->hash;
  }
  fio_str_info_s state = fio_str_info(&obj2str(o)->str);
  obj2str(o)->hash = fiobj_hash_string(state.data, state.len);
  return obj2str(o)->hash;
}